

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall
Js::FunctionBody::GetLineCharOffset
          (FunctionBody *this,int byteCodeOffset,ULONG *_line,LONG *_charOffset,
          bool canAllocateLineCache)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Utf8SourceInfo *this_00;
  undefined4 *puVar4;
  StatementMap *pSVar5;
  StatementMap *map;
  StatementData data;
  SmallSpanSequenceIter iter;
  int startCharOfStatement;
  bool canAllocateLineCache_local;
  LONG *_charOffset_local;
  ULONG *_line_local;
  int byteCodeOffset_local;
  FunctionBody *this_local;
  
  this_00 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)this);
  bVar2 = Utf8SourceInfo::GetIsLibraryCode(this_00);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xc76,"(!this->GetUtf8SourceInfo()->GetIsLibraryCode())",
                                "!this->GetUtf8SourceInfo()->GetIsLibraryCode()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  iter.accumulatedBytecodeBegin = (this->super_ParseableFunctionInfo).m_cchStartOffset;
  if ((this->m_sourceInfo).pSpanSequence == (Type)0x0) {
    pSVar5 = GetEnclosingStatementMapFromByteCode(this,byteCodeOffset,false);
    if ((pSVar5 != (StatementMap *)0x0) &&
       (bVar2 = ParseableFunctionInfo::EndsAfter
                          (&this->super_ParseableFunctionInfo,(long)(pSVar5->sourceSpan).begin),
       bVar2)) {
      iter.accumulatedBytecodeBegin = (pSVar5->sourceSpan).begin;
    }
  }
  else {
    SmallSpanSequenceIter::SmallSpanSequenceIter((SmallSpanSequenceIter *)&data);
    SmallSpanSequence::Reset((this->m_sourceInfo).pSpanSequence,(SmallSpanSequenceIter *)&data);
    StatementData::StatementData((StatementData *)&map);
    BVar3 = SmallSpanSequence::GetMatchingStatementFromBytecode
                      ((this->m_sourceInfo).pSpanSequence,byteCodeOffset,
                       (SmallSpanSequenceIter *)&data,(StatementData *)&map);
    if ((BVar3 != 0) &&
       (bVar2 = ParseableFunctionInfo::EndsAfter(&this->super_ParseableFunctionInfo,(long)(int)map),
       bVar2)) {
      iter.accumulatedBytecodeBegin = (int)map;
    }
  }
  bVar2 = GetLineCharOffsetFromStartChar
                    (this,iter.accumulatedBytecodeBegin,_line,_charOffset,canAllocateLineCache);
  return bVar2;
}

Assistant:

bool FunctionBody::GetLineCharOffset(int byteCodeOffset, ULONG* _line, LONG* _charOffset, bool canAllocateLineCache /*= true*/)
    {
        Assert(!this->GetUtf8SourceInfo()->GetIsLibraryCode());

        int startCharOfStatement = this->m_cchStartOffset; // Default to the start of this function

        if (m_sourceInfo.pSpanSequence)
        {
            SmallSpanSequenceIter iter;
            m_sourceInfo.pSpanSequence->Reset(iter);

            StatementData data;

            if (m_sourceInfo.pSpanSequence->GetMatchingStatementFromBytecode(byteCodeOffset, iter, data)
                && EndsAfter(data.sourceBegin))
            {
                startCharOfStatement = data.sourceBegin;
            }
        }
        else
        {
            Js::FunctionBody::StatementMap* map = this->GetEnclosingStatementMapFromByteCode(byteCodeOffset, false);
            if (map && EndsAfter(map->sourceSpan.begin))
            {
                startCharOfStatement = map->sourceSpan.begin;
            }
        }

        return this->GetLineCharOffsetFromStartChar(startCharOfStatement, _line, _charOffset, canAllocateLineCache);
    }